

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cradix-improved.c
# Opt level: O2

void cradix_rantala(LPPSTR a,UINT n)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  uchar *puVar4;
  UINT UVar5;
  LPSTR puVar6;
  LPPSTR ta;
  LPBYTE __ptr;
  Stack *pSVar7;
  ulong uVar8;
  size_t i_1;
  long lVar9;
  ulong *puVar10;
  LPPSTR ppuVar11;
  size_t i;
  ulong uVar12;
  uchar **a_00;
  byte *pbVar13;
  long lVar14;
  ulong uVar15;
  UINT d;
  byte *__src;
  ulong uVar16;
  bool bVar17;
  UINT count [256];
  LPPSTR GrpKP [256];
  LPSTR GrpKB [256];
  
  ta = (LPPSTR)malloc(n * 8);
  __ptr = (LPBYTE)malloc(n * 4);
  _sp->sa = a;
  _sp->sk = __ptr;
  _sp->sn = (int)n;
  pSVar7 = _sp + 1;
  piVar1 = &_sp->sb;
  _sp = pSVar7;
  *piVar1 = 0;
  for (lVar9 = 0; lVar9 != 0xff; lVar9 = lVar9 + 1) {
    count[lVar9] = 0;
  }
LAB_001d482e:
  do {
    if (pSVar7 < (Stack *)((long)&stack[0].sa + 1)) {
      free(ta);
      free(__ptr);
      return;
    }
    _sp = pSVar7 + -1;
    a_00 = pSVar7[-1].sa;
    __src = pSVar7[-1].sk;
    uVar16 = (ulong)pSVar7[-1].sn;
    iVar3 = pSVar7[-1].sb;
    d = (UINT)iVar3;
    if (__src != (byte *)0x0) {
      uVar8 = d & 3;
      if (uVar8 != 0) {
        uVar12 = uVar16;
        pbVar13 = __src;
        while (bVar17 = uVar12 != 0, uVar12 = uVar12 - 1, bVar17) {
          count[*pbVar13] = count[*pbVar13] + 1;
          pbVar13 = pbVar13 + (4 - uVar8);
        }
LAB_001d4906:
        puVar10 = count;
        do {
          uVar12 = *puVar10;
          puVar10 = puVar10 + 1;
        } while (uVar12 == 0);
        uVar15 = 0;
        if (uVar12 < uVar16) {
          uVar15 = uVar16;
        }
        uVar12 = uVar8 ^ 3;
        GrpKP[0] = a_00;
        GrpKB[0] = __src;
        pbVar13 = __src;
        ppuVar11 = a_00;
        for (lVar9 = 0; lVar9 != 0xff; lVar9 = lVar9 + 1) {
          UVar5 = count[lVar9];
          ppuVar11 = ppuVar11 + UVar5;
          GrpKP[lVar9 + 1] = ppuVar11;
          pbVar13 = pbVar13 + UVar5 * uVar12;
          GrpKB[lVar9 + 1] = pbVar13;
        }
        lVar9 = 4 - uVar8;
        memcpy(ta,a_00,uVar15 * 8);
        pbVar13 = __src;
        for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
          *GrpKP[*pbVar13] = ta[uVar8];
          GrpKP[*pbVar13] = GrpKP[*pbVar13] + 1;
          pbVar13 = pbVar13 + lVar9;
        }
        memcpy(ta,__src,lVar9 * uVar16);
        ppuVar11 = ta;
        for (uVar8 = 0; uVar8 != uVar16; uVar8 = uVar8 + 1) {
          bVar2 = *(byte *)ppuVar11;
          puVar6 = GrpKB[bVar2];
          for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
            puVar6[uVar15] = *(byte *)((long)ppuVar11 + uVar15 + 1);
          }
          ppuVar11 = (LPPSTR)((long)ppuVar11 + lVar9);
          GrpKB[bVar2] = puVar6 + uVar12;
        }
        lVar9 = 0;
        do {
          if (lVar9 != 0) {
            pSVar7 = _sp;
            if (lVar9 == 0xff) goto LAB_001d482e;
            uVar16 = count[lVar9];
            if (uVar16 < 0x15) {
              if (1 < uVar16) {
                insertion_sort(a_00,(int)uVar16,d);
              }
            }
            else {
              _sp->sa = a_00;
              _sp->sk = __src;
              _sp->sn = (int)uVar16;
              piVar1 = &_sp->sb;
              _sp = _sp + 1;
              *piVar1 = iVar3 + 1;
            }
          }
          a_00 = a_00 + count[lVar9];
          __src = __src + count[lVar9] * uVar12;
          count[lVar9] = 0;
          lVar9 = lVar9 + 1;
        } while( true );
      }
      if (0x80 < (uint)pSVar7[-1].sn) {
        pbVar13 = __src;
        for (uVar12 = 0; uVar12 != uVar16; uVar12 = uVar12 + 1) {
          puVar4 = a_00[uVar12];
          lVar9 = 0;
          do {
            lVar14 = lVar9;
            if (lVar14 == 4) goto LAB_001d48bb;
            bVar2 = puVar4[lVar14 + d];
            pbVar13[lVar14] = bVar2;
            lVar9 = lVar14 + 1;
          } while (bVar2 != 0);
          pbVar13[lVar14] = 0;
LAB_001d48bb:
          pbVar13 = pbVar13 + 4;
        }
        for (uVar12 = 0; uVar16 != uVar12; uVar12 = uVar12 + 1) {
          count[__src[uVar12 * 4]] = count[__src[uVar12 * 4]] + 1;
        }
        goto LAB_001d4906;
      }
    }
    RDFK(GrpKP,a_00,uVar16,ta,count,d);
    pSVar7 = _sp;
  } while( true );
}

Assistant:

void cradix_rantala(LPPSTR a, UINT n)
{
	UINT kbsd, kbsd1, i, j, stage, d, MEMSIZE;
	UINT *cptr, gs, count[AS];
	LPSTR tj, tk, ax, tl, kb, ss, tt, GrpKB[AS];
	LPPSTR GrpKP[AS], ak, ta, tc, t;
	if (sizeof(LPPSTR)>sizeof(unsigned char)*BS)
		MEMSIZE=sizeof(LPPSTR);
	else
		MEMSIZE=sizeof(unsigned char)*BS;
	/* workspace */
	ta = (LPPSTR)malloc(n * MEMSIZE);
	/* memory for key buffers */
	tk = (LPBYTE)malloc(n * sizeof(unsigned char) * BS);
	tj=tk;
	push(a, tk, n, 0); for (i=AL; i<AH; i++) count[i]=0;
	while (!stackempty()) {
		pop(a, tk, n, stage);
		if (tk) {
			/* set the counters and
			   fill the key buffers if necessary */
			if ((d=stage%BS)!=0)
				for (i=0, tl=tk; i<n; i++, tl+=(BS-d))
					count[*tl]++;
			else {
				if (n>KBC)
					FillKeyBuffer(a, tk, count, n, stage);
				else {
					RDFK(GrpKP, a, n, ta, count, stage);
					continue;
				}
			}
			/* check if there is only 1 group */
			cptr=&count[AL];
			while (*cptr<1) cptr++;
			if (*cptr<n) gs=n; else gs=0;
			/* calculate both key ptr and
			   key buffer addresses */
			kbsd=BS-d, kbsd1=kbsd-1;
			GrpKP[AL]=a; GrpKB[AL]=tk;
			for (ak=a, ax=tk, i=AL; i<AH; i++) {
				GrpKP[i+1]=ak+=count[i];
				GrpKB[i+1]=ax+=count[i]*kbsd1;
			}

			/* permute the key ptrs */
			memcpy(ta, a, sizeof(LPSTR)*gs);
			for (i=0, ax=tk, tc=ta; i<gs;
					i++, ax+=kbsd, tc++) {
				*GrpKP[*ax]=*tc; GrpKP[*ax]++;
			}
			/* permute the key buffers */
			memcpy(ta, tk, sizeof(unsigned char)*n*kbsd);
			for (i=0, kb=(LPBYTE)ta; i<n; i++, *t+=kbsd1) {
				t=&GrpKB[*kb]; ss=*t; tt=kb+1;
				for (j=0; j<kbsd1; j++)
				{ *ss=*tt; ss++; tt++; }
				kb+=kbsd;
			}
			/* down 1 level */
			for (ak=a, ax=tk, i=AL; i<AH; i++) {
				if (splittable(i))
				{ push(ak, ax, count[i], stage+1); }
				else if (count[i]>1 && i>0)
					insertion_sort(ak, count[i], stage);
				ak+=count[i]; ax+=count[i]*(kbsd1);
				count[i]=0;
			}
		}
		else RDFK(GrpKP, a, n, ta, count, stage);
	}
	free((void*)ta);
	free((void*)tj);
}